

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

optional<std::pair<CNetMessage,_bool>_> * __thiscall CNode::PollMessage(CNode *this)

{
  bool bVar1;
  reference pvVar2;
  AnnotatedMixin<std::mutex> *in_RSI;
  optional<std::pair<CNetMessage,_bool>_> *in_RDI;
  AnnotatedMixin<std::mutex> *__offin;
  __off64_t *__offout;
  size_t __len;
  long in_FS_OFFSET;
  list<CNetMessage,_std::allocator<CNetMessage>_> msgs;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock103;
  uint in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  pair<CNetMessage,_bool> *in_stack_fffffffffffffef0;
  optional<std::pair<CNetMessage,_bool>_> *this_00;
  undefined8 in_stack_ffffffffffffff08;
  optional<std::pair<CNetMessage,_bool>_> *pszName;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_stack_ffffffffffffff28;
  int local_a0;
  int local_90;
  optional<std::pair<CNetMessage,_bool>_> local_88;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pszName = in_RDI;
  MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  __offout = (__off64_t *)0xeed;
  __len = 0;
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (in_stack_ffffffffffffff28,in_RSI,(char *)pszName,(char *)in_RDI,
             (int)((ulong)in_stack_ffffffffffffff08 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffff08 >> 0x18,0));
  bVar1 = std::__cxx11::list<CNetMessage,_std::allocator<CNetMessage>_>::empty
                    ((list<CNetMessage,_std::allocator<CNetMessage>_> *)
                     CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  if (bVar1) {
    std::optional<std::pair<CNetMessage,_bool>_>::optional(in_RDI);
  }
  else {
    this_00 = &local_88;
    std::__cxx11::list<CNetMessage,_std::allocator<CNetMessage>_>::list
              ((list<CNetMessage,_std::allocator<CNetMessage>_> *)
               CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    std::__cxx11::list<CNetMessage,_std::allocator<CNetMessage>_>::begin
              ((list<CNetMessage,_std::allocator<CNetMessage>_> *)in_stack_fffffffffffffef0);
    std::_List_const_iterator<CNetMessage>::_List_const_iterator
              ((_List_const_iterator<CNetMessage> *)
               CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),(iterator *)0x10141f7);
    __offin = in_RSI + 0x12;
    std::__cxx11::list<CNetMessage,_std::allocator<CNetMessage>_>::begin
              ((list<CNetMessage,_std::allocator<CNetMessage>_> *)in_stack_fffffffffffffef0);
    std::_List_const_iterator<CNetMessage>::_List_const_iterator
              ((_List_const_iterator<CNetMessage> *)
               CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),(iterator *)0x1014221);
    std::__cxx11::list<CNetMessage,_std::allocator<CNetMessage>_>::splice
              ((list<CNetMessage,_std::allocator<CNetMessage>_> *)this_00,local_90,
               (__off64_t *)__offin,local_a0,__offout,__len,in_stack_fffffffffffffee8);
    pvVar2 = std::__cxx11::list<CNetMessage,_std::allocator<CNetMessage>_>::front
                       ((list<CNetMessage,_std::allocator<CNetMessage>_> *)in_stack_fffffffffffffef0
                       );
    in_RSI[0x12].super_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
         (__pthread_internal_list *)
         ((long)in_RSI[0x12].super_mutex.super___mutex_base._M_mutex.__data.__list.__prev -
         (ulong)pvVar2->m_raw_message_size);
    std::atomic<bool>::operator=
              ((atomic<bool> *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),false);
    std::__cxx11::list<CNetMessage,_std::allocator<CNetMessage>_>::front
              ((list<CNetMessage,_std::allocator<CNetMessage>_> *)in_stack_fffffffffffffef0);
    std::__cxx11::list<CNetMessage,_std::allocator<CNetMessage>_>::empty
              ((list<CNetMessage,_std::allocator<CNetMessage>_> *)
               CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    std::make_pair<CNetMessage,bool>
              (&in_stack_fffffffffffffef0->first,
               (bool *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    std::optional<std::pair<CNetMessage,_bool>_>::optional<std::pair<CNetMessage,_bool>,_true>
              (this_00,in_stack_fffffffffffffef0);
    std::pair<CNetMessage,_bool>::~pair
              ((pair<CNetMessage,_bool> *)
               CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    std::__cxx11::list<CNetMessage,_std::allocator<CNetMessage>_>::~list
              ((list<CNetMessage,_std::allocator<CNetMessage>_> *)
               CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  }
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pszName;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<std::pair<CNetMessage, bool>> CNode::PollMessage()
{
    LOCK(m_msg_process_queue_mutex);
    if (m_msg_process_queue.empty()) return std::nullopt;

    std::list<CNetMessage> msgs;
    // Just take one message
    msgs.splice(msgs.begin(), m_msg_process_queue, m_msg_process_queue.begin());
    m_msg_process_queue_size -= msgs.front().m_raw_message_size;
    fPauseRecv = m_msg_process_queue_size > m_recv_flood_size;

    return std::make_pair(std::move(msgs.front()), !m_msg_process_queue.empty());
}